

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord2.cpp
# Opt level: O0

KBOOL __thiscall KDIS::DATA_TYPE::ConeRecord2::operator==(ConeRecord2 *this,ConeRecord2 *Value)

{
  KFLOAT32 *pKVar1;
  float fVar2;
  KBOOL KVar3;
  ConeRecord2 *Value_local;
  ConeRecord2 *this_local;
  
  KVar3 = EnvironmentRecord::operator!=((EnvironmentRecord *)this,(EnvironmentRecord *)Value);
  if (KVar3) {
    this_local._7_1_ = false;
  }
  else {
    KVar3 = WorldCoordinates::operator!=
                      (&(this->super_ConeRecord1).m_Loc,&(Value->super_ConeRecord1).m_Loc);
    if (KVar3) {
      this_local._7_1_ = false;
    }
    else {
      KVar3 = EulerAngles::operator!=
                        (&(this->super_ConeRecord1).m_Ori,&(Value->super_ConeRecord1).m_Ori);
      if (KVar3) {
        this_local._7_1_ = false;
      }
      else {
        KVar3 = Vector::operator!=(&this->m_Velocity,&Value->m_Velocity);
        if (KVar3) {
          this_local._7_1_ = false;
        }
        else {
          KVar3 = Vector::operator!=(&this->m_AngularVelocity,&Value->m_AngularVelocity);
          if (KVar3) {
            this_local._7_1_ = false;
          }
          else {
            fVar2 = (float)(this->super_ConeRecord1).m_f32Height;
            pKVar1 = &(Value->super_ConeRecord1).m_f32Height;
            if ((fVar2 != (float)*pKVar1) || (NAN(fVar2) || NAN((float)*pKVar1))) {
              this_local._7_1_ = false;
            }
            else if (((float)this->m_f32ddtHeight != (float)Value->m_f32ddtHeight) ||
                    (NAN((float)this->m_f32ddtHeight) || NAN((float)Value->m_f32ddtHeight))) {
              this_local._7_1_ = false;
            }
            else {
              fVar2 = (float)(this->super_ConeRecord1).m_f32PeakAngle;
              pKVar1 = &(Value->super_ConeRecord1).m_f32PeakAngle;
              if ((fVar2 != (float)*pKVar1) || (NAN(fVar2) || NAN((float)*pKVar1))) {
                this_local._7_1_ = false;
              }
              else if (((float)this->m_f32ddtPeak != (float)Value->m_f32ddtPeak) ||
                      (NAN((float)this->m_f32ddtPeak) || NAN((float)Value->m_f32ddtPeak))) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL ConeRecord2::operator == ( const ConeRecord2 & Value )const
{
    if( EnvironmentRecord::operator !=( Value ) )         return false;
    if( m_Loc               != Value.m_Loc )              return false;
    if( m_Ori               != Value.m_Ori )              return false;
    if( m_Velocity          != Value.m_Velocity )         return false;
    if( m_AngularVelocity   != Value.m_AngularVelocity )  return false;
    if( m_f32Height         != Value.m_f32Height )        return false;
    if( m_f32ddtHeight      != Value.m_f32ddtHeight )     return false;
    if( m_f32PeakAngle      != Value.m_f32PeakAngle )     return false;
    if( m_f32ddtPeak        != Value.m_f32ddtPeak )       return false;
    return true;
}